

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

uint8 * __thiscall
rw::ps2::MatPipeline::collectData
          (MatPipeline *this,Geometry *g,InstanceData *inst,Mesh *m,uint8 **data)

{
  uint32 uVar1;
  uint unpack;
  uint8 *__dest;
  uint32 uVar2;
  uint32 uVar3;
  uint8 *puVar4;
  uint uVar5;
  uint8 **ppuVar6;
  uint i_1;
  uint8 *puVar7;
  uint i;
  long lVar8;
  byte bVar9;
  InstMeshInfo im;
  uint8 *datap [10];
  
  bVar9 = 0;
  getInstMeshInfo(&im,this,g,m);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2.cpp line: 769"
  ;
  puVar4 = (uint8 *)(*DAT_00143848)(m->numIndices * im.vertexSize,0x3000f);
  puVar7 = puVar4;
  for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
    if (this->attribs[lVar8] != (PipeAttribute *)0x0) {
      uVar5 = this->attribs[lVar8]->attrib;
      if ((uVar5 & 6) == 0) {
        data[lVar8] = puVar7;
        uVar1 = m->numIndices;
        uVar2 = attribSize(uVar5);
        puVar7 = puVar7 + uVar2 * uVar1;
      }
      else {
        data[lVar8] = inst->data + (im.attribPos[lVar8] << 4);
      }
    }
  }
  ppuVar6 = datap;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *ppuVar6 = *data;
    data = data + (ulong)bVar9 * -2 + 1;
    ppuVar6 = ppuVar6 + (ulong)bVar9 * -2 + 1;
  }
  uVar1 = g->meshHeader->flags;
  puVar7 = inst->data + (ulong)(im.numBrokenAttribs == 0) * 0x10;
  for (uVar5 = 0; uVar5 != im.numBatches; uVar5 = uVar5 + 1) {
    for (lVar8 = 4; lVar8 != 0xe; lVar8 = lVar8 + 1) {
      if (this->attribs[lVar8 + -4] != (PipeAttribute *)0x0) {
        puVar7 = puVar7 + (ulong)((this->attribs[lVar8 + -4]->attrib & 6) != 0) * 0x20;
      }
    }
    uVar2 = im.lastBatchVertCount;
    if (uVar5 < im.numBatches - 1) {
      uVar2 = im.batchVertCount;
    }
    puVar7 = puVar7 + (ulong)(im.numBrokenAttribs != 0) * 0x10;
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      if ((this->attribs[lVar8] != (PipeAttribute *)0x0) &&
         (unpack = this->attribs[lVar8]->attrib, (unpack & 6) == 0)) {
        uVar3 = attribSize(unpack);
        if ((*(uint *)(puVar7 + 0xc) & 0xff004000) != unpack) {
          fprintf(_stderr,"unexpected unpack: %08x %08x\n",(ulong)*(uint *)(puVar7 + 0xc),
                  (ulong)unpack);
        }
        __dest = datap[lVar8];
        memcpy(__dest,puVar7 + 0x10,(ulong)(uVar3 * uVar2));
        datap[lVar8] = __dest + uVar3 * ((uint)(uVar1 != 1) * 2 + -2 + uVar2);
        puVar7 = puVar7 + 0x10 + (uVar3 * uVar2 + 0xf & 0xfffffff0);
      }
    }
    puVar7 = puVar7 + 0x10;
  }
  return puVar4;
}

Assistant:

uint8*
MatPipeline::collectData(Geometry *g, InstanceData *inst, Mesh *m, uint8 *data[])
{
	PipeAttribute *a;
	InstMeshInfo im = getInstMeshInfo(this, g, m);

	uint8 *raw = rwNewT(uint8, im.vertexSize*m->numIndices, MEMDUR_EVENT | ID_GEOMETRY);
	uint8 *dp = raw;
	for(uint i = 0; i < nelem(this->attribs); i++)
		if((a = this->attribs[i])) {
			if(a->attrib & AT_RW){
				data[i] = inst->data + im.attribPos[i]*0x10;
			}else{
				data[i] = dp;
				dp += m->numIndices*attribSize(a->attrib);
			}
		}

	uint8 *datap[nelem(this->attribs)];
	memcpy(datap, data, sizeof(datap));

	uint32 overlap = g->meshHeader->flags == 1 ? 2 : 0;
	uint32 *p = (uint32*)inst->data;
	if(im.numBrokenAttribs == 0)
		p += 4;
	for(uint32 j = 0; j < im.numBatches; j++){
		uint32 nverts = j < im.numBatches-1 ? im.batchVertCount :
		                                      im.lastBatchVertCount;
		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && a->attrib & AT_RW)
				p += 8;
		if(im.numBrokenAttribs)
			p += 4;
		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && (a->attrib & AT_RW) == 0){
				uint32 asz = attribSize(a->attrib);
				p += 4;
				if((p[-1] & 0xff004000) != a->attrib){
					fprintf(stderr, "unexpected unpack: %08x %08x\n", p[-1], a->attrib);
					assert(0 && "unexpected unpack\n");
				}
				memcpy(datap[i], p, asz*nverts);
				datap[i] += asz*(nverts-overlap);
				p += QWC(asz*nverts)*4;
			}
		p += 4;
	}
	return raw;
}